

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O2

void __thiscall
QMenuBarPrivate::copyActionToPlatformMenu(QMenuBarPrivate *this,QAction *action,QPlatformMenu *menu)

{
  undefined1 uVar1;
  QAction *pQVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QAction *)(**(code **)(*(long *)menu + 0x88))(menu);
  if (pQVar2 != action) {
    (**(code **)(*(long *)menu + 0x80))(menu,action);
  }
  QAction::text();
  (**(code **)(*(long *)menu + 0x90))(menu,&QStack_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  uVar1 = QAction::isVisible();
  (**(code **)(*(long *)menu + 0xb0))(menu,uVar1);
  uVar1 = QAction::isEnabled();
  (**(code **)(*(long *)menu + 0xa0))(menu,uVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuBarPrivate::copyActionToPlatformMenu(const QAction *action, QPlatformMenu *menu)
{
    const auto tag = reinterpret_cast<quintptr>(action);
    if (menu->tag() != tag)
        menu->setTag(tag);
    menu->setText(action->text());
    menu->setVisible(action->isVisible());
    menu->setEnabled(action->isEnabled());
}